

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

int av1_get_last_show_frame(AV1_COMP *cpi,YV12_BUFFER_CONFIG *frame)

{
  int iVar1;
  
  iVar1 = -1;
  if ((cpi->last_show_frame_buf != (RefCntBuffer *)0x0) &&
     ((cpi->oxcf).algo_cfg.skip_postproc_filtering == false)) {
    memcpy(frame,&cpi->last_show_frame_buf->buf,0xd0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int av1_get_last_show_frame(AV1_COMP *cpi, YV12_BUFFER_CONFIG *frame) {
  if (cpi->last_show_frame_buf == NULL ||
      cpi->oxcf.algo_cfg.skip_postproc_filtering)
    return -1;

  *frame = cpi->last_show_frame_buf->buf;
  return 0;
}